

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

bool __thiscall Assimp::Importer::ValidateFlags(Importer *this,uint pFlags)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  reference ppBVar4;
  uint local_38;
  uint a;
  bool have;
  uint mask;
  uint pFlags_local;
  Importer *this_local;
  
  bVar1 = _ValidateFlags(pFlags);
  if (bVar1) {
    for (a = 1; a < 0x80000000; a = a << 1) {
      if ((pFlags & 0xfffffbff & a) != 0) {
        bVar1 = false;
        for (local_38 = 0;
            sVar3 = std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::size
                              (&this->pimpl->mPostProcessingSteps), local_38 < sVar3;
            local_38 = local_38 + 1) {
          ppBVar4 = std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::
                    operator[](&this->pimpl->mPostProcessingSteps,(ulong)local_38);
          uVar2 = (*(*ppBVar4)->_vptr_BaseProcess[2])(*ppBVar4,(ulong)a);
          if ((uVar2 & 1) != 0) {
            bVar1 = true;
            break;
          }
        }
        if (!bVar1) {
          return false;
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Importer::ValidateFlags(unsigned int pFlags) const
{
    ASSIMP_BEGIN_EXCEPTION_REGION();
    // run basic checks for mutually exclusive flags
    if(!_ValidateFlags(pFlags)) {
        return false;
    }

    // ValidateDS does not anymore occur in the pp list, it plays an awesome extra role ...
#ifdef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
    if (pFlags & aiProcess_ValidateDataStructure) {
        return false;
    }
#endif
    pFlags &= ~aiProcess_ValidateDataStructure;

    // Now iterate through all bits which are set in the flags and check whether we find at least
    // one pp plugin which handles it.
    for (unsigned int mask = 1; mask < (1u << (sizeof(unsigned int)*8-1));mask <<= 1) {

        if (pFlags & mask) {

            bool have = false;
            for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++)   {
                if (pimpl->mPostProcessingSteps[a]-> IsActive(mask) ) {

                    have = true;
                    break;
                }
            }
            if (!have) {
                return false;
            }
        }
    }
    ASSIMP_END_EXCEPTION_REGION(bool);
    return true;
}